

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O2

void __thiscall
polyscope::render::backend_openGL3_glfw::GLEngine::registerShaderProgram
          (GLEngine *this,string *name,
          vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
          *spec,DrawMode *dm)

{
  __hashtable *__h;
  pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
  pStack_78;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  local_58;
  
  std::
  pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
  ::
  pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode,_true>
            (&pStack_78,spec,dm);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>,_true>
            (&local_58,name,&pStack_78);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&this->registeredShaderPrograms,&local_58);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::~pair(&local_58);
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&pStack_78.first);
  return;
}

Assistant:

void GLEngine::registerShaderProgram(const std::string& name, const std::vector<ShaderStageSpecification>& spec,
                                     const DrawMode& dm) {
  registeredShaderPrograms.insert({name, {spec, dm}});
}